

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::GenAccessChainStoreReplacement
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,uint32_t valId,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *newInsts)

{
  LocalAccessChainConvertPass *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecorationManager *pDVar4;
  long lVar5;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  uint32_t varId;
  LocalAccessChainConvertPass *local_138;
  uint32_t local_12c;
  uint32_t local_128;
  uint32_t varPteTypeId;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  uint32_t local_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined4 local_b8;
  SmallVector<unsigned_int,_2UL> local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ins_in_opnds;
  SmallVector<unsigned_int,_2UL> local_70;
  uint32_t local_48 [6];
  
  uVar2 = Instruction::NumInOperands(ptrInst);
  local_138 = this;
  if (uVar2 == 1) {
    local_48[0] = Instruction::GetSingleWordInOperand(ptrInst,0);
    init_list._M_len = 1;
    init_list._M_array = local_48;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list);
    local_e8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),&local_118);
    init_list_00._M_len = 1;
    init_list_00._M_array = &varId;
    varId = valId;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list_00);
    local_b8 = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b0,&local_70);
    ins_in_opnds.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ins_in_opnds.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ins_in_opnds.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &ins_in_opnds,local_e8,&ins_in_opnds);
    BuildAndAppendInst(local_138,OpStore,0,0,&ins_in_opnds,newInsts);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&ins_in_opnds);
    lVar5 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_e8 + lVar5));
      lVar5 = lVar5 + -0x30;
    } while (lVar5 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
LAB_004db94f:
    bVar1 = true;
  }
  else {
    uVar2 = BuildAndAppendVarLoad(this,ptrInst,&varId,&varPteTypeId,newInsts);
    if (uVar2 != 0) {
      local_12c = valId;
      local_120 = newInsts;
      pDVar4 = IRContext::get_decoration_mgr((this->super_MemPass).super_Pass.context_);
      uVar3 = varId;
      local_118._vptr_SmallVector._0_4_ = 0;
      local_e8._0_8_ = 0;
      local_e8._8_8_ = 0;
      local_d8 = 0;
      std::vector<spv::Decoration,std::allocator<spv::Decoration>>::
      _M_range_initialize<spv::Decoration_const*>
                ((vector<spv::Decoration,std::allocator<spv::Decoration>> *)local_e8,&local_118);
      analysis::DecorationManager::CloneDecorations
                (pDVar4,uVar3,uVar2,
                 (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_e8);
      std::_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>::~_Vector_base
                ((_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_e8);
      uVar3 = Pass::TakeNextId((Pass *)this);
      if (uVar3 != 0) {
        local_48[0] = local_12c;
        init_list_01._M_len = 1;
        init_list_01._M_array = local_48;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list_01);
        local_e8._0_4_ = 1;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),&local_118);
        init_list_02._M_len = 1;
        init_list_02._M_array = &local_128;
        local_128 = uVar2;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list_02);
        local_b8 = 1;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b0,&local_70);
        ins_in_opnds.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ins_in_opnds.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ins_in_opnds.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &ins_in_opnds,local_e8,&ins_in_opnds);
        lVar5 = 0x38;
        do {
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)(local_e8 + lVar5));
          lVar5 = lVar5 + -0x30;
        } while (lVar5 != -0x28);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
        this_00 = local_138;
        AppendConstantOperands(local_138,ptrInst,&ins_in_opnds);
        BuildAndAppendInst(this_00,OpCompositeInsert,varPteTypeId,uVar3,&ins_in_opnds,local_120);
        pDVar4 = IRContext::get_decoration_mgr((this_00->super_MemPass).super_Pass.context_);
        local_118._vptr_SmallVector._0_4_ = 0;
        local_e8._0_8_ = 0;
        local_e8._8_8_ = 0;
        local_d8 = 0;
        std::vector<spv::Decoration,std::allocator<spv::Decoration>>::
        _M_range_initialize<spv::Decoration_const*>
                  ((vector<spv::Decoration,std::allocator<spv::Decoration>> *)local_e8,&local_118,
                   (undefined1 *)((long)&local_118._vptr_SmallVector + 4));
        analysis::DecorationManager::CloneDecorations
                  (pDVar4,varId,uVar3,
                   (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_e8);
        std::_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>::~_Vector_base
                  ((_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_e8);
        local_128 = varId;
        init_list_03._M_len = 1;
        init_list_03._M_array = &local_128;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list_03);
        local_e8._0_4_ = 1;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),&local_118);
        init_list_04._M_len = 1;
        init_list_04._M_array = &local_ec;
        local_ec = uVar3;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list_04);
        local_b8 = 1;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b0,&local_70);
        local_48[0] = 0;
        local_48[1] = 0;
        local_48[2] = 0;
        local_48[3] = 0;
        local_48[4] = 0;
        local_48[5] = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_48
                   ,local_e8,&ins_in_opnds);
        BuildAndAppendInst(this_00,OpStore,0,0,
                           (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)local_48,local_120);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_48);
        lVar5 = 0x38;
        do {
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)(local_e8 + lVar5));
          lVar5 = lVar5 + -0x30;
        } while (lVar5 != -0x28);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&ins_in_opnds);
        goto LAB_004db94f;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool LocalAccessChainConvertPass::GenAccessChainStoreReplacement(
    const Instruction* ptrInst, uint32_t valId,
    std::vector<std::unique_ptr<Instruction>>* newInsts) {
  if (ptrInst->NumInOperands() == 1) {
    // An access chain with no indices is essentially a copy.  However, we still
    // have to create a new store because the old ones will be deleted.
    BuildAndAppendInst(
        spv::Op::OpStore, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID,
          {ptrInst->GetSingleWordInOperand(kAccessChainPtrIdInIdx)}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}}},
        newInsts);
    return true;
  }

  // Build and append load of variable in ptrInst
  uint32_t varId;
  uint32_t varPteTypeId;
  const uint32_t ldResultId =
      BuildAndAppendVarLoad(ptrInst, &varId, &varPteTypeId, newInsts);
  if (ldResultId == 0) {
    return false;
  }

  context()->get_decoration_mgr()->CloneDecorations(
      varId, ldResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Insert
  const uint32_t insResultId = TakeNextId();
  if (insResultId == 0) {
    return false;
  }
  std::vector<Operand> ins_in_opnds = {
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ldResultId}}};
  AppendConstantOperands(ptrInst, &ins_in_opnds);
  BuildAndAppendInst(spv::Op::OpCompositeInsert, varPteTypeId, insResultId,
                     ins_in_opnds, newInsts);

  context()->get_decoration_mgr()->CloneDecorations(
      varId, insResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Store
  BuildAndAppendInst(spv::Op::OpStore, 0, 0,
                     {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {varId}},
                      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {insResultId}}},
                     newInsts);
  return true;
}